

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded(QPDFAcroFormDocumentHelper *this)

{
  element_type *peVar1;
  bool bVar2;
  pointer pQVar3;
  QPDFPageObjectHelper *this_00;
  element_type *aoh;
  undefined1 local_138 [24];
  element_type *local_120;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_110;
  QPDFFormFieldObjectHelper ffh;
  QPDFPageObjectHelper local_c0;
  QPDFAnnotationObjectHelper local_88;
  string local_50;
  
  bVar2 = getNeedAppearances(this);
  if (bVar2) {
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)&ffh,(this->super_QPDFDocumentHelper).qpdf);
    QPDFPageDocumentHelper::getAllPages(&local_110,(QPDFPageDocumentHelper *)&ffh);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&ffh);
    pQVar3 = local_110.
             super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl
             .super__Vector_impl_data._M_start;
    while( true ) {
      if (pQVar3 == local_110.
                    super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                    _M_impl.super__Vector_impl_data._M_finish) break;
      this_00 = pQVar3;
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_c0,pQVar3);
      getWidgetAnnotationsForPage
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 (local_138 + 0x10),(QPDFAcroFormDocumentHelper *)this_00,&local_c0);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_c0);
      peVar1 = local_120;
      for (aoh = (element_type *)local_138._16_8_; aoh != peVar1;
          aoh = (element_type *)&aoh->object_description) {
        QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper
                  (&local_88,(QPDFAnnotationObjectHelper *)aoh);
        getFieldForAnnotation(&ffh,this,&local_88);
        QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_88);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_(&local_50,&ffh);
        bVar2 = std::operator==(&local_50,"/Btn");
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar2) {
          bVar2 = QPDFFormFieldObjectHelper::isRadioButton(&ffh);
          if (!bVar2) {
            bVar2 = QPDFFormFieldObjectHelper::isCheckbox(&ffh);
            if (!bVar2) goto LAB_00145282;
          }
          QPDFFormFieldObjectHelper::getValue((QPDFFormFieldObjectHelper *)local_138);
          QPDFFormFieldObjectHelper::setV(&ffh,(QPDFObjectHandle *)local_138,true);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8));
        }
        else {
          QPDFFormFieldObjectHelper::generateAppearance(&ffh,(QPDFAnnotationObjectHelper *)aoh);
        }
LAB_00145282:
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&ffh);
      }
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                ((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                 (local_138 + 0x10));
      pQVar3 = pQVar3 + 1;
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_110);
    setNeedAppearances(this,false);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded()
{
    if (!getNeedAppearances()) {
        return;
    }

    for (auto const& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
        for (auto& aoh: getWidgetAnnotationsForPage(page)) {
            QPDFFormFieldObjectHelper ffh = getFieldForAnnotation(aoh);
            if (ffh.getFieldType() == "/Btn") {
                // Rather than generating appearances for button fields, rely on what's already
                // there. Just make sure /AS is consistent with /V, which we can do by resetting the
                // value of the field back to itself. This code is referenced in a comment in
                // QPDFFormFieldObjectHelper::generateAppearance.
                if (ffh.isRadioButton() || ffh.isCheckbox()) {
                    ffh.setV(ffh.getValue());
                }
            } else {
                ffh.generateAppearance(aoh);
            }
        }
    }
    setNeedAppearances(false);
}